

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IncompleteCubeWrapModeCase::createTexture(IncompleteCubeWrapModeCase *this)

{
  int width;
  GLsizei width_00;
  GLsizei height;
  bool bVar1;
  GLenum GVar2;
  TestLog *this_00;
  int *piVar3;
  void *pixels;
  MessageBuilder *pMVar4;
  RGBA local_254;
  MessageBuilder local_250;
  char *local_d0;
  char *extension;
  int local_9c;
  int targetNdx;
  PixelBufferAccess local_88;
  GLuint local_4c;
  undefined1 local_48 [4];
  GLuint texture;
  TextureLevel levelData;
  TextureFormat fmt;
  TestLog *log;
  IncompleteCubeWrapModeCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TexCubeCompletenessCase).m_testCtx);
  levelData.m_data.m_cap = (size_t)glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48,(TextureFormat *)&levelData.m_data.m_cap)
  ;
  glwGenTextures(1,&local_4c);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,local_4c);
  glwTexParameteri(0x8513,0x2802,this->m_wrapS);
  glwTexParameteri(0x8513,0x2803,*(GLint *)&(this->super_TexCubeCompletenessCase).field_0x84);
  glwTexParameteri(0x8513,0x2801,0x2600);
  glwTexParameteri(0x8513,0x2800,0x2600);
  piVar3 = tcu::Vector<int,_2>::x(&this->m_size);
  width = *piVar3;
  piVar3 = tcu::Vector<int,_2>::y(&this->m_size);
  tcu::TextureLevel::setSize((TextureLevel *)local_48,width,*piVar3,1);
  tcu::TextureLevel::getAccess(&local_88,(TextureLevel *)local_48);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff68,0.0,0.0,1.0,1.0);
  tcu::clear(&local_88,(Vec4 *)&stack0xffffffffffffff68);
  for (local_9c = 0; local_9c < 6; local_9c = local_9c + 1) {
    GVar2 = *(GLenum *)(s_cubeTargets + (long)local_9c * 4);
    piVar3 = tcu::Vector<int,_2>::x(&this->m_size);
    width_00 = *piVar3;
    piVar3 = tcu::Vector<int,_2>::y(&this->m_size);
    height = *piVar3;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&extension,(TextureLevel *)local_48);
    pixels = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&extension);
    glwTexImage2D(GVar2,0,0x1908,width_00,height,0,0x1908,0x1401,pixels);
  }
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x339);
  local_d0 = "GL_OES_texture_npot";
  bVar1 = isExtensionSupported(this->m_ctxInfo,"GL_OES_texture_npot");
  if (bVar1) {
    tcu::TestLog::operator<<(&local_250,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_250,&local_d0);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [48])" supported, assuming completeness test to pass.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
    tcu::RGBA::RGBA(&local_254,0,0,0xff,0xff);
    (this->super_TexCubeCompletenessCase).m_compareColor.m_value = local_254.m_value;
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return;
}

Assistant:

void IncompleteCubeWrapModeCase::createTexture (void)
{
	TestLog&			log			= m_testCtx.getLog();
	tcu::TextureFormat	fmt			= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel	levelData	(fmt);

	GLuint texture;
	glGenTextures(1, &texture);
	glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	levelData.setSize(m_size.x(), m_size.y());
	clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(s_cubeTargets); targetNdx++)
		glTexImage2D(s_cubeTargets[targetNdx], 0, GL_RGBA, m_size.x(), m_size.y(), 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());

	GLU_CHECK_MSG("Set texturing state");

	const char* extension = "GL_OES_texture_npot";
	if (isExtensionSupported(m_ctxInfo, extension))
	{
		log << TestLog::Message << extension << " supported, assuming completeness test to pass." << TestLog::EndMessage;
		m_compareColor = RGBA(0,0,255,255);
	}
}